

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_get_subject_alt_name(uchar **p,uchar *end,mbedtls_x509_sequence *subject_alt_name)

{
  uchar uVar1;
  int iVar2;
  mbedtls_x509_sequence *pmVar3;
  uchar *puVar4;
  size_t tag_len;
  size_t len;
  size_t local_38;
  size_t local_30;
  
  iVar2 = mbedtls_asn1_get_tag(p,end,&local_30,0x30);
  if (iVar2 == 0) {
    puVar4 = *p;
    iVar2 = -0x2566;
    if (puVar4 + local_30 == end) {
      while (puVar4 < end) {
        if (end == puVar4 || (long)end - (long)puVar4 < 0) {
          return -0x2560;
        }
        uVar1 = *puVar4;
        *p = puVar4 + 1;
        iVar2 = mbedtls_asn1_get_len(p,end,&local_38);
        if (iVar2 != 0) goto LAB_00111b1a;
        if (-1 < (char)uVar1) {
          return -0x2562;
        }
        pmVar3 = subject_alt_name;
        if (uVar1 == 0x82) {
          if ((subject_alt_name->buf).p != (uchar *)0x0) {
            if (subject_alt_name->next != (mbedtls_asn1_sequence *)0x0) {
              return -0x2500;
            }
            pmVar3 = (mbedtls_x509_sequence *)calloc(1,0x20);
            subject_alt_name->next = pmVar3;
            if (pmVar3 == (mbedtls_x509_sequence *)0x0) {
              return -0x256a;
            }
          }
          (pmVar3->buf).tag = 0x82;
          puVar4 = *p;
          (pmVar3->buf).p = puVar4;
          (pmVar3->buf).len = local_38;
          puVar4 = puVar4 + local_38;
        }
        else {
          puVar4 = *p + local_38;
        }
        *p = puVar4;
        subject_alt_name = pmVar3;
      }
      subject_alt_name->next = (mbedtls_asn1_sequence *)0x0;
      iVar2 = -0x2566;
      if (*p == end) {
        iVar2 = 0;
      }
    }
  }
  else {
LAB_00111b1a:
    iVar2 = iVar2 + -0x2500;
  }
  return iVar2;
}

Assistant:

static int x509_get_subject_alt_name( unsigned char **p,
                                      const unsigned char *end,
                                      mbedtls_x509_sequence *subject_alt_name )
{
    int ret;
    size_t len, tag_len;
    mbedtls_asn1_buf *buf;
    unsigned char tag;
    mbedtls_asn1_sequence *cur = subject_alt_name;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        if( ( end - *p ) < 1 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_OUT_OF_DATA );

        tag = **p;
        (*p)++;
        if( ( ret = mbedtls_asn1_get_len( p, end, &tag_len ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        if( ( tag & MBEDTLS_ASN1_CONTEXT_SPECIFIC ) != MBEDTLS_ASN1_CONTEXT_SPECIFIC )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

        /* Skip everything but DNS name */
        if( tag != ( MBEDTLS_ASN1_CONTEXT_SPECIFIC | 2 ) )
        {
            *p += tag_len;
            continue;
        }

        /* Allocate and assign next pointer */
        if( cur->buf.p != NULL )
        {
            if( cur->next != NULL )
                return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS );

            cur->next = mbedtls_calloc( 1, sizeof( mbedtls_asn1_sequence ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                        MBEDTLS_ERR_ASN1_ALLOC_FAILED );

            cur = cur->next;
        }

        buf = &(cur->buf);
        buf->tag = tag;
        buf->p = *p;
        buf->len = tag_len;
        *p += buf->len;
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}